

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O2

void going_set_snd_timeo(int sockfd,int sec,int usec)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  timeval time;
  
  time.tv_sec = (__time_t)sec;
  time.tv_usec = (__suseconds_t)usec;
  iVar1 = setsockopt(sockfd,1,0x15,&time,0x10);
  __stream = _stderr;
  if (-1 < iVar1) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    pcVar3 = "None";
  }
  else {
    pcVar3 = strerror(*piVar2);
  }
  fprintf(__stream,"[ERROR] (%s:%d: errno: %s) setsockopt: SO_SNDTIMEO failed.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
          ,0x15d,pcVar3);
  exit(-1);
}

Assistant:

void going_set_snd_timeo(int sockfd, int sec, int usec)
 {
 	struct timeval time = {sec, usec};
 	int ret = setsockopt(sockfd, SOL_SOCKET, SO_SNDTIMEO, &time, sizeof(time));
 	if(ret < 0){
 		log_err("setsockopt: SO_SNDTIMEO failed.");
 		exit(-1);
 	}
 }